

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 LexExtractNowdoc(SyStream *pStream,SyToken *pToken)

{
  uchar *puVar1;
  undefined8 uVar2;
  uchar *pB1;
  uint nSize;
  sxi32 sVar3;
  ushort **ppuVar4;
  uchar *puVar5;
  bool bVar6;
  uchar *zCur;
  SyString sStr;
  SyString sDelim;
  uchar *zPtr;
  uchar *zEnd;
  uchar *zIn;
  SyToken *pToken_local;
  SyStream *pStream_local;
  
  zEnd = pStream->zText;
  puVar1 = pStream->zEnd;
  while( true ) {
    bVar6 = false;
    if ((zEnd < puVar1) && (bVar6 = false, *zEnd < 0xc0)) {
      ppuVar4 = __ctype_b_loc();
      bVar6 = false;
      if (((*ppuVar4)[(int)(uint)*zEnd] & 0x2000) != 0) {
        bVar6 = *zEnd != '\n';
      }
    }
    if (!bVar6) break;
    zEnd = zEnd + 1;
  }
  if (zEnd < puVar1) {
    if ((*zEnd == '\'') || (*zEnd == '\"')) {
      zEnd = zEnd + 1;
    }
    pB1 = zEnd;
    if (((*zEnd < 0xc0) && (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)(uint)*zEnd] & 8) == 0)) &&
       (*zEnd != '_')) {
      pStream_local._4_4_ = -0x19;
    }
    else {
      while( true ) {
        sDelim._8_8_ = zEnd;
        while( true ) {
          bVar6 = false;
          if (((ulong)sDelim._8_8_ < puVar1) && (bVar6 = false, *(byte *)sDelim._8_8_ < 0xc0)) {
            ppuVar4 = __ctype_b_loc();
            bVar6 = true;
            if (((*ppuVar4)[(int)(uint)*(byte *)sDelim._8_8_] & 8) == 0) {
              bVar6 = *(char *)sDelim._8_8_ == '_';
            }
          }
          if (!bVar6) break;
          sDelim._8_8_ = sDelim._8_8_ + 1;
        }
        if (((ulong)sDelim._8_8_ < puVar1) && (0xbf < *(byte *)sDelim._8_8_)) {
          do {
            sDelim._8_8_ = sDelim._8_8_ + 1;
            bVar6 = false;
            if ((ulong)sDelim._8_8_ < puVar1) {
              bVar6 = (*(byte *)sDelim._8_8_ & 0xc0) == 0x80;
            }
          } while (bVar6);
        }
        if ((uchar *)sDelim._8_8_ == zEnd) break;
        zEnd = (uchar *)sDelim._8_8_;
      }
      nSize = (int)zEnd - (int)pB1;
      if ((*zEnd == '\"') || (*zEnd == '\'')) {
        zEnd = zEnd + 1;
      }
      while( true ) {
        bVar6 = false;
        if ((zEnd < puVar1) && (bVar6 = false, *zEnd < 0xc0)) {
          ppuVar4 = __ctype_b_loc();
          bVar6 = false;
          if (((*ppuVar4)[(int)(uint)*zEnd] & 0x2000) != 0) {
            bVar6 = *zEnd != '\n';
          }
        }
        if (!bVar6) break;
        zEnd = zEnd + 1;
      }
      if (((nSize == 0) || (puVar1 <= zEnd)) || (*zEnd != '\n')) {
        pStream_local._4_4_ = -0x19;
      }
      else {
        pStream->nLine = pStream->nLine + 1;
        puVar5 = zEnd + 1;
        zEnd = puVar5;
        while( true ) {
          while( true ) {
            bVar6 = false;
            if (zEnd < puVar1) {
              bVar6 = *zEnd != '\n';
            }
            if (!bVar6) break;
            zEnd = zEnd + 1;
          }
          if (puVar1 <= zEnd) break;
          pStream->nLine = pStream->nLine + 1;
          zEnd = zEnd + 1;
          if ((nSize <= (uint)((int)puVar1 - (int)zEnd)) &&
             (sVar3 = SyMemcmp(pB1,zEnd,nSize), sVar3 == 0)) {
            sDelim._8_8_ = zEnd + nSize;
            while( true ) {
              uVar2 = sDelim._8_8_;
              bVar6 = false;
              if (((ulong)sDelim._8_8_ < puVar1) && (bVar6 = false, *(byte *)sDelim._8_8_ < 0xc0)) {
                ppuVar4 = __ctype_b_loc();
                bVar6 = false;
                if (((*ppuVar4)[(int)(uint)*(byte *)sDelim._8_8_] & 0x2000) != 0) {
                  bVar6 = *(char *)sDelim._8_8_ != '\n';
                }
              }
              if (!bVar6) break;
              sDelim._8_8_ = sDelim._8_8_ + 1;
            }
            if (puVar1 <= (ulong)sDelim._8_8_) {
              pStream->zText = (uchar *)sDelim._8_8_;
              goto LAB_0013699b;
            }
            if (*(char *)sDelim._8_8_ == ';') {
              do {
                sDelim._8_8_ = sDelim._8_8_ + 1;
                bVar6 = false;
                if (((ulong)sDelim._8_8_ < puVar1) && (bVar6 = false, *(byte *)sDelim._8_8_ < 0xc0))
                {
                  ppuVar4 = __ctype_b_loc();
                  bVar6 = false;
                  if (((*ppuVar4)[(int)(uint)*(byte *)sDelim._8_8_] & 0x2000) != 0) {
                    bVar6 = *(char *)sDelim._8_8_ != '\n';
                  }
                }
              } while (bVar6);
              if ((puVar1 <= (ulong)sDelim._8_8_) || (*(char *)sDelim._8_8_ == '\n')) {
                pStream->zText = (uchar *)uVar2;
                goto LAB_0013699b;
              }
            }
            else if (*(char *)sDelim._8_8_ == '\n') {
              pStream->zText = (uchar *)sDelim._8_8_;
              goto LAB_0013699b;
            }
            zEnd = (uchar *)sDelim._8_8_;
          }
        }
        pStream->zText = pStream->zEnd;
LAB_0013699b:
        pToken->nType = 0x10000;
        (pToken->sData).zString = (char *)puVar5;
        (pToken->sData).nByte = (int)zEnd - (int)puVar5;
        while( true ) {
          bVar6 = false;
          if (((pToken->sData).nByte != 0) &&
             (bVar6 = false, (byte)(pToken->sData).zString[(pToken->sData).nByte - 1] < 0xc0)) {
            ppuVar4 = __ctype_b_loc();
            bVar6 = ((*ppuVar4)[(int)(pToken->sData).zString[(pToken->sData).nByte - 1]] & 0x2000)
                    != 0;
          }
          if (!bVar6) break;
          (pToken->sData).nByte = (pToken->sData).nByte - 1;
        }
        pStream_local._4_4_ = 0;
      }
    }
  }
  else {
    pStream_local._4_4_ = -0x19;
  }
  return pStream_local._4_4_;
}

Assistant:

static sxi32 LexExtractNowdoc(SyStream *pStream, SyToken *pToken)
{
	const unsigned char *zIn  = pStream->zText;
	const unsigned char *zEnd = pStream->zEnd;
	const unsigned char *zPtr;
	SyString sDelim;
	SyString sStr;
	/* Jump leading white spaces */
	while( zIn < zEnd && zIn[0] < 0xc0 && SyisSpace(zIn[0]) && zIn[0] != '\n' ){
		zIn++;
	}
	if( zIn >= zEnd ){
		/* A simple symbol, return immediately */
		return SXERR_CONTINUE;
	}
	if( zIn[0] == '\'' || zIn[0] == '"' ){
		zIn++;
	}
	if( zIn[0] < 0xc0 && !SyisAlphaNum(zIn[0]) && zIn[0] != '_' ){
		/* Invalid delimiter, return immediately */
		return SXERR_CONTINUE;
	}
	/* Isolate the identifier */
	sDelim.zString = (const char *)zIn;
	for(;;){
		zPtr = zIn;
		/* Skip alphanumeric stream */
		while( zPtr < zEnd && zPtr[0] < 0xc0 && (SyisAlphaNum(zPtr[0]) || zPtr[0] == '_') ){
			zPtr++;
		}
		if( zPtr < zEnd && zPtr[0] >= 0xc0 ){
			zPtr++;
			/* UTF-8 stream */
			while( zPtr < zEnd && ((zPtr[0] & 0xc0) == 0x80) ){
				zPtr++;
			}
		}
		if( zPtr == zIn ){
			/* Not an UTF-8 or alphanumeric stream */
			break;
		}
		/* Synchronize pointers */
		zIn = zPtr;
	}
	/* Get the identifier length */
	sDelim.nByte = (sxu32)((const char *)zIn-sDelim.zString);
	if( zIn[0] == '"' || zIn[0] == '\'' ){
		/* Jump the trailing single quote */
		zIn++;
	}
	/* Jump trailing white spaces */
	while( zIn < zEnd && zIn[0] < 0xc0 && SyisSpace(zIn[0]) && zIn[0] != '\n' ){
		zIn++;
	}
	if( sDelim.nByte <= 0 || zIn >= zEnd || zIn[0] != '\n' ){
		/* Invalid syntax */
		return SXERR_CONTINUE;
	}
	pStream->nLine++; /* Increment line counter */
	zIn++;
	/* Isolate the delimited string */
	sStr.zString = (const char *)zIn;
	/* Go and found the closing delimiter */
	for(;;){
		/* Synchronize with the next line */
		while( zIn < zEnd && zIn[0] != '\n' ){
			zIn++;
		}
		if( zIn >= zEnd ){
			/* End of the input reached, break immediately */
			pStream->zText = pStream->zEnd;
			break;
		}
		pStream->nLine++; /* Increment line counter */
		zIn++;
		if( (sxu32)(zEnd - zIn) >= sDelim.nByte && SyMemcmp((const void *)sDelim.zString, (const void *)zIn, sDelim.nByte) == 0 ){
			zPtr = &zIn[sDelim.nByte];
			while( zPtr < zEnd && zPtr[0] < 0xc0 && SyisSpace(zPtr[0]) && zPtr[0] != '\n' ){
				zPtr++;
			}
			if( zPtr >= zEnd ){
				/* End of input */
				pStream->zText = zPtr;
				break;
			}
			if( zPtr[0] == ';' ){
				const unsigned char *zCur = zPtr;
				zPtr++;
				while( zPtr < zEnd && zPtr[0] < 0xc0 && SyisSpace(zPtr[0]) && zPtr[0] != '\n' ){
					zPtr++;
				}
				if( zPtr >= zEnd || zPtr[0] == '\n' ){
					/* Closing delimiter found, break immediately */
					pStream->zText = zCur; /* Keep the semi-colon */
					break;
				}
			}else if( zPtr[0] == '\n' ){
				/* Closing delimiter found, break immediately */
				pStream->zText = zPtr; /* Synchronize with the stream cursor */
				break;
			}
			/* Synchronize pointers and continue searching */
			zIn = zPtr;
		}
	} /* For(;;) */
	/* Get the delimited string length */
	sStr.nByte = (sxu32)((const char *)zIn-sStr.zString);
	/* Record token type and length */
	pToken->nType = JX9_TK_NOWDOC;
	SyStringDupPtr(&pToken->sData, &sStr);
	/* Remove trailing white spaces */
	SyStringRightTrim(&pToken->sData);
	/* All done */
	return SXRET_OK;
}